

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O0

void __thiscall CppUnit::PlugInManager::removeListener(PlugInManager *this,TestResult *eventManager)

{
  bool bVar1;
  reference pPVar2;
  iterator local_58;
  undefined1 local_38 [8];
  iterator it;
  TestResult *eventManager_local;
  PlugInManager *this_local;
  
  it._M_node = (_Map_pointer)eventManager;
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  begin((iterator *)local_38,&this->m_plugIns);
  while( true ) {
    std::
    deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
    end(&local_58,&this->m_plugIns);
    bVar1 = std::operator!=((_Self *)local_38,&local_58);
    if (!bVar1) break;
    pPVar2 = std::
             _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
             ::operator*((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                          *)local_38);
    (*pPVar2->m_interface->_vptr_CppUnitTestPlugIn[2])(pPVar2->m_interface,it._M_node);
    std::
    _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
    ::operator++((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                  *)local_38);
  }
  return;
}

Assistant:

void 
PlugInManager::removeListener( TestResult *eventManager )
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
    (*it).m_interface->removeListener( eventManager );
}